

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase317::run(TestCase317 *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues;
  Bar **params;
  Bar **params_00;
  long lVar4;
  undefined1 auVar5 [16];
  Bar *m;
  Bar bar;
  Fault f;
  String *in_stack_ffffffffffffff78;
  undefined ***pppuVar6;
  undefined ***local_78;
  undefined **local_70;
  String local_68;
  String local_50;
  String local_38;
  
  pppuVar6 = &local_70;
  local_70 = &PTR__Foo_001bf560;
  auVar5 = __dynamic_cast(pppuVar6,&(anonymous_namespace)::Foo::typeinfo,
                          &(anonymous_namespace)::Bar::typeinfo);
  local_78 = auVar5._0_8_;
  if (local_78 != (undefined ***)0x0) {
    if ((pppuVar6 != local_78) && (_::Debug::minSeverity < 3)) {
      str<char_const(&)[31]>(&local_68,(kj *)"failed: expected (&bar) == (m)",auVar5._8_8_);
      str<kj::(anonymous_namespace)::Bar*&>(&local_50,(kj *)&stack0xffffffffffffff80,params);
      str<kj::(anonymous_namespace)::Bar*&>(&local_38,(kj *)&local_78,params_00);
      argValues.size_ = (size_t)pppuVar6;
      argValues.ptr = in_stack_ffffffffffffff78;
      _::Debug::logInternal
                ((Debug *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                 ,(char *)0x14b,2,0x188328,(char *)&local_68,argValues);
      lVar4 = 0x30;
      do {
        lVar1 = *(long *)((long)&local_68.content.ptr + lVar4);
        if (lVar1 != 0) {
          uVar2 = *(undefined8 *)((long)&local_68.content.size_ + lVar4);
          *(undefined8 *)((long)&local_68.content.ptr + lVar4) = 0;
          *(undefined8 *)((long)&local_68.content.size_ + lVar4) = 0;
          puVar3 = *(undefined8 **)((long)&local_68.content.disposer + lVar4);
          (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
        }
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
    }
    lVar4 = __dynamic_cast(&local_70,&(anonymous_namespace)::Foo::typeinfo,
                           &(anonymous_namespace)::Baz::typeinfo,0);
    if ((lVar4 != 0) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x14f,ERROR,
                 "\"failed: expected \" \"dynamicDowncastIfAvailable<Baz>(foo) == nullptr\"",
                 (char (*) [65])"failed: expected dynamicDowncastIfAvailable<Baz>(foo) == nullptr");
    }
    return;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
            ((Fault *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
             ,0x14d,FAILED,(char *)0x0,"\"Dynamic downcast returned null.\"",
             (char (*) [32])"Dynamic downcast returned null.");
  _::Debug::Fault::fatal((Fault *)&local_68);
}

Assistant:

virtual ~Bar() {}